

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O3

void __thiscall SymbolTable::Print(SymbolTable *this,ofstream *out)

{
  _Hash_node_base *p_Var1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>
  elem;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>
  local_60;
  
  p_Var1 = (this->classes)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>
      ::pair(&local_60,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>
              *)(p_Var1 + 1));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"class: {",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
      ClassInfo::Print(local_60.second.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
      if (local_60.second.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.second.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
        operator_delete(local_60.first._M_dataplus._M_p);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void SymbolTable::Print( std::ofstream& out )
{
	for( auto elem : classes ) {
		out << "class: {" << "\n";
		(elem.second)->Print( out );
		out << "}" << "\n";
	}
}